

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expression.c
# Opt level: O2

token * comma_expression(dmr_C *C,token *token,expression **tree)

{
  token *ptVar1;
  expression *peVar2;
  char *pcVar3;
  expression *peVar4;
  expression *local_48;
  expression *right;
  expression *local_38;
  
  local_38 = (expression *)0x0;
  ptVar1 = dmrC_assignment_expression(C,token,&local_38);
  if (local_38 == (expression *)0x0) {
    peVar4 = (expression *)0x0;
  }
  else {
    peVar4 = local_38;
    right = (expression *)tree;
    while( true ) {
      tree = (expression **)right;
      if ((((ulong)ptVar1->pos & 0x3f) != 0x11) ||
         (local_48 = (expression *)0x0, (ptVar1->field_2).special != 0x2c)) goto LAB_00108884;
      peVar2 = dmrC_alloc_expression(C,ptVar1->pos,0x15);
      ptVar1 = dmrC_assignment_expression(C,ptVar1->next,&local_48);
      if (local_48 == (expression *)0x0) break;
      peVar2->field_0x1 =
           (byte)((ushort)*(undefined2 *)peVar4 >> 8) & (byte)((ushort)*(undefined2 *)local_48 >> 8)
           & 1;
      peVar2->op = 0x2c;
      (peVar2->field_5).field_3.unop = peVar4;
      (peVar2->field_5).field_2.string = (string *)local_48;
      peVar4 = peVar2;
    }
    local_38 = peVar4;
    pcVar3 = dmrC_show_special(C,0x2c);
    dmrC_sparse_error(C,ptVar1->pos,"No right hand side of \'%s\'-expression",pcVar3);
    peVar4 = local_38;
    tree = (expression **)right;
  }
LAB_00108884:
  *tree = peVar4;
  return ptVar1;
}

Assistant:

static struct token *comma_expression(struct dmr_C *C, struct token *token, struct expression **tree)
{
	LR_BINOP_EXPRESSION(C,
		token, tree, EXPR_COMMA, dmrC_assignment_expression,
		(op == ',')
	);
}